

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance> *this
          ,Context *context)

{
  Context *pCVar1;
  undefined8 uVar2;
  pointer pPVar3;
  WrapMode WVar4;
  VkFormat VVar5;
  int iVar6;
  Texture3DLodControlTestInstance *this_00;
  
  this_00 = (Texture3DLodControlTestInstance *)operator_new(800);
  texture::anon_unknown_0::Texture3DLodControlTestInstance::Texture3DLodControlTestInstance
            (this_00,context,&this->m_testsParameters);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture3DMaxLevelTestInstance_00d03cb8;
  pCVar1 = *(Context **)
            &(this->m_testsParameters).super_Texture3DTestCaseParameters.
             super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.minFilter;
  uVar2 = *(undefined8 *)
           &(this->m_testsParameters).super_Texture3DTestCaseParameters.
            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.magFilter;
  WVar4 = (this->m_testsParameters).super_Texture3DTestCaseParameters.
          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.wrapT;
  VVar5 = (this->m_testsParameters).super_Texture3DTestCaseParameters.
          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.format;
  this_00[1].super_TestInstance._vptr_TestInstance =
       *(_func_int ***)
        &(this->m_testsParameters).super_Texture3DTestCaseParameters.
         super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters;
  this_00[1].super_TestInstance.m_context = pCVar1;
  *(undefined8 *)((long)&this_00[1].super_TestInstance.m_context + 4) = uVar2;
  this_00[1].m_texHeight = WVar4;
  this_00[1].m_texDepth = VVar5;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
            ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
             &this_00[1].m_testParameters,
             &(this->m_testsParameters).super_Texture3DTestCaseParameters.
              super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.programs);
  iVar6 = (this->m_testsParameters).super_Texture3DTestCaseParameters.
          super_Texture2DTestCaseParameters.height;
  pPVar3 = *(pointer *)&(this->m_testsParameters).super_Texture3DTestCaseParameters.wrapR;
  this_00[1].m_testParameters.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.format =
       (this->m_testsParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters
       .width;
  *(int *)&this_00[1].m_testParameters.super_Texture3DTestCaseParameters.
           super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.field_0x1c =
       iVar6;
  this_00[1].m_testParameters.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.programs.
  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
  _M_impl.super__Vector_impl_data._M_start = pPVar3;
  pPVar3 = (pointer)(this->m_testsParameters).super_TextureMipmapCommonTestCaseParameters.
                    minFilterName;
  *(pointer *)
   ((long)&this_00[1].m_testParameters.super_Texture3DTestCaseParameters.
           super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl + 8) =
       *(pointer *)&(this->m_testsParameters).super_TextureMipmapCommonTestCaseParameters;
  *(pointer *)
   ((long)&this_00[1].m_testParameters.super_Texture3DTestCaseParameters.
           super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl + 0x10) = pPVar3;
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}